

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O2

void __thiscall
VectorSUnitTest_copy_constructor_Test::TestBody(VectorSUnitTest_copy_constructor_Test *this)

{
  long lVar1;
  char *pcVar2;
  char *in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertHelper local_a20;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar__3;
  AssertHelper local_9e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_raw_src;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
  vs_diff_capacity_move;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>
  vs_diff_capacity;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  v_src_move_diff_capacity;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  v_src_move;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  vs_move;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL> vs
  ;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  v_src;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"0",(allocator<char> *)&vs_diff_capacity_move);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(vs_diff_capacity.data_ + 0x18),"1",(allocator<char> *)&v_src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(vs_diff_capacity.data_ + 0x38),"2",(allocator<char> *)&vs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(vs_diff_capacity.data_ + 0x58),"3",(allocator<char> *)&v_src_move);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(vs_diff_capacity.data_ + 0x78),"4",(allocator<char> *)&vs_move);
  __l._M_len = 5;
  __l._M_array = (iterator)&vs_diff_capacity;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&v_raw_src,__l,(allocator_type *)&v_src_move_diff_capacity);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(vs_diff_capacity.data_ + lVar1 + -8));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  vs_diff_capacity.size_ =
       (size_type)
       v_raw_src.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  vs_diff_capacity_move.size_ =
       (size_type)
       v_raw_src.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  estl::vector_s<std::__cxx11::string,10ul>::
  vector_s<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector_s<std::__cxx11::string,10ul> *)&v_src,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vs_diff_capacity,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vs_diff_capacity_move);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  vector_s(&vs,&v_src);
  vs_diff_capacity_move.data_[0] = '\0';
  vs_diff_capacity_move.data_[1] = '\0';
  vs_diff_capacity_move.data_[2] = '\0';
  vs_diff_capacity_move.data_[3] = '\0';
  vs_diff_capacity_move.data_[4] = '\0';
  vs_diff_capacity_move.data_[5] = '\0';
  vs_diff_capacity_move.data_[6] = '\0';
  vs_diff_capacity_move.data_[7] = '\0';
  vs_diff_capacity_move.size_ = CONCAT71(vs_diff_capacity_move.size_._1_7_,vs.size_ != 0);
  if (vs.size_ == 0) {
    testing::Message::Message((Message *)&v_src_move);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vs_diff_capacity,(internal *)&vs_diff_capacity_move,
               (AssertionResult *)"vs.empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vs_move,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x6b,(char *)vs_diff_capacity.size_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vs_move,(Message *)&v_src_move);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vs_move);
    std::__cxx11::string::~string((string *)&vs_diff_capacity);
    if ((long *)CONCAT44(v_src_move.size_._4_4_,(undefined4)v_src_move.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(v_src_move.size_._4_4_,(undefined4)v_src_move.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  v_src_move.size_._0_4_ = 5;
  vs_diff_capacity_move.size_ = vs.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&vs_diff_capacity,"5u","vs.size()",(uint *)&v_src_move,
             &vs_diff_capacity_move.size_);
  if ((char)vs_diff_capacity.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity_move);
    if (vs_diff_capacity.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move,(Message *)&vs_diff_capacity_move);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move);
    if (vs_diff_capacity_move.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity_move.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"0",(allocator<char> *)&v_src_move);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&vs_diff_capacity_move,"std::string(\"0\")","vs[0]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vs_diff_capacity,
             vs.data_ptr_);
  std::__cxx11::string::~string((string *)&vs_diff_capacity);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move,(Message *)&vs_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move);
    if (vs_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"1",(allocator<char> *)&v_src_move);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&vs_diff_capacity_move,"std::string(\"1\")","vs[1]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vs_diff_capacity,
             vs.data_ptr_ + 1);
  std::__cxx11::string::~string((string *)&vs_diff_capacity);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move,(Message *)&vs_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move);
    if (vs_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"2",(allocator<char> *)&v_src_move);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&vs_diff_capacity_move,"std::string(\"2\")","vs[2]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vs_diff_capacity,
             vs.data_ptr_ + 2);
  std::__cxx11::string::~string((string *)&vs_diff_capacity);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move,(Message *)&vs_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move);
    if (vs_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"3",(allocator<char> *)&v_src_move);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&vs_diff_capacity_move,"std::string(\"3\")","vs[3]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vs_diff_capacity,
             vs.data_ptr_ + 3);
  std::__cxx11::string::~string((string *)&vs_diff_capacity);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move,(Message *)&vs_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move);
    if (vs_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"4",(allocator<char> *)&v_src_move);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&vs_diff_capacity_move,"std::string(\"4\")","vs[4]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vs_diff_capacity,
             vs.data_ptr_ + 4);
  std::__cxx11::string::~string((string *)&vs_diff_capacity);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move,(Message *)&vs_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move);
    if (vs_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  vs_diff_capacity.size_ =
       (size_type)
       v_raw_src.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  vs_diff_capacity_move.size_ =
       (size_type)
       v_raw_src.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  estl::vector_s<std::__cxx11::string,10ul>::
  vector_s<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector_s<std::__cxx11::string,10ul> *)&v_src_move,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vs_diff_capacity,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vs_diff_capacity_move);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  vector_s(&vs_move,&v_src_move);
  vs_diff_capacity_move.data_[0] = '\0';
  vs_diff_capacity_move.data_[1] = '\0';
  vs_diff_capacity_move.data_[2] = '\0';
  vs_diff_capacity_move.data_[3] = '\0';
  vs_diff_capacity_move.data_[4] = '\0';
  vs_diff_capacity_move.data_[5] = '\0';
  vs_diff_capacity_move.data_[6] = '\0';
  vs_diff_capacity_move.data_[7] = '\0';
  vs_diff_capacity_move.size_ = CONCAT71(vs_diff_capacity_move.size_._1_7_,vs_move.size_ != 0);
  if (vs_move.size_ == 0) {
    testing::Message::Message((Message *)&v_src_move_diff_capacity);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vs_diff_capacity,(internal *)&vs_diff_capacity_move,
               (AssertionResult *)"vs_move.empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x75,(char *)vs_diff_capacity.size_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_18,(Message *)&v_src_move_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    std::__cxx11::string::~string((string *)&vs_diff_capacity);
    if (v_src_move_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)v_src_move_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  v_src_move_diff_capacity.size_ = CONCAT44(v_src_move_diff_capacity.size_._4_4_,5);
  vs_diff_capacity_move.size_ = vs_move.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&vs_diff_capacity,"5u","vs_move.size()",(uint *)&v_src_move_diff_capacity,
             &vs_diff_capacity_move.size_);
  if ((char)vs_diff_capacity.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity_move);
    if (vs_diff_capacity.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move_diff_capacity,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move_diff_capacity,(Message *)&vs_diff_capacity_move);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move_diff_capacity);
    if (vs_diff_capacity_move.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity_move.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"0",(allocator<char> *)&v_src_move_diff_capacity);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&vs_diff_capacity_move,"std::string(\"0\")","vs_move[0]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vs_diff_capacity,
             vs_move.data_ptr_);
  std::__cxx11::string::~string((string *)&vs_diff_capacity);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move_diff_capacity,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move_diff_capacity,(Message *)&vs_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move_diff_capacity);
    if (vs_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"1",(allocator<char> *)&v_src_move_diff_capacity);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&vs_diff_capacity_move,"std::string(\"1\")","vs_move[1]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vs_diff_capacity,
             vs_move.data_ptr_ + 1);
  std::__cxx11::string::~string((string *)&vs_diff_capacity);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move_diff_capacity,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move_diff_capacity,(Message *)&vs_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move_diff_capacity);
    if (vs_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"2",(allocator<char> *)&v_src_move_diff_capacity);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&vs_diff_capacity_move,"std::string(\"2\")","vs_move[2]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vs_diff_capacity,
             vs_move.data_ptr_ + 2);
  std::__cxx11::string::~string((string *)&vs_diff_capacity);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move_diff_capacity,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move_diff_capacity,(Message *)&vs_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move_diff_capacity);
    if (vs_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"3",(allocator<char> *)&v_src_move_diff_capacity);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&vs_diff_capacity_move,"std::string(\"3\")","vs_move[3]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vs_diff_capacity,
             vs_move.data_ptr_ + 3);
  std::__cxx11::string::~string((string *)&vs_diff_capacity);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move_diff_capacity,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move_diff_capacity,(Message *)&vs_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move_diff_capacity);
    if (vs_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity,"4",(allocator<char> *)&v_src_move_diff_capacity);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&vs_diff_capacity_move,"std::string(\"4\")","vs_move[4]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vs_diff_capacity,
             vs_move.data_ptr_ + 4);
  std::__cxx11::string::~string((string *)&vs_diff_capacity);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v_src_move_diff_capacity,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&v_src_move_diff_capacity,(Message *)&vs_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v_src_move_diff_capacity);
    if (vs_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  estl::vector_s<std::__cxx11::string,12ul>::vector_s<10ul>
            ((vector_s<std::__cxx11::string,12ul> *)&vs_diff_capacity,&v_src);
  v_src_move_diff_capacity.data_[0] = '\0';
  v_src_move_diff_capacity.data_[1] = '\0';
  v_src_move_diff_capacity.data_[2] = '\0';
  v_src_move_diff_capacity.data_[3] = '\0';
  v_src_move_diff_capacity.data_[4] = '\0';
  v_src_move_diff_capacity.data_[5] = '\0';
  v_src_move_diff_capacity.data_[6] = '\0';
  v_src_move_diff_capacity.data_[7] = '\0';
  v_src_move_diff_capacity.size_ =
       CONCAT71(v_src_move_diff_capacity.size_._1_7_,vs_diff_capacity.size_ != 0);
  if (vs_diff_capacity.size_ == 0) {
    testing::Message::Message((Message *)&gtest_ar_18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vs_diff_capacity_move,(internal *)&v_src_move_diff_capacity,
               (AssertionResult *)"vs_diff_capacity.empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x7e,(char *)vs_diff_capacity_move.size_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar_18)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&vs_diff_capacity_move);
    if (gtest_ar_18._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_18._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)v_src_move_diff_capacity.data_);
  gtest_ar_18._0_4_ = 5;
  v_src_move_diff_capacity.size_ = vs_diff_capacity.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&vs_diff_capacity_move,"5u","vs_diff_capacity.size()",(uint *)&gtest_ar_18,
             &v_src_move_diff_capacity.size_);
  if ((char)vs_diff_capacity_move.size_ == '\0') {
    testing::Message::Message((Message *)&v_src_move_diff_capacity);
    if (vs_diff_capacity_move.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vs_diff_capacity_move.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_18,(Message *)&v_src_move_diff_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    if (v_src_move_diff_capacity.size_ != 0) {
      (**(code **)(*(long *)v_src_move_diff_capacity.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vs_diff_capacity_move.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity_move,"0",(allocator<char> *)&gtest_ar_18);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&v_src_move_diff_capacity,"std::string(\"0\")","vs_diff_capacity[0]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &vs_diff_capacity_move,vs_diff_capacity.data_ptr_);
  std::__cxx11::string::~string((string *)&vs_diff_capacity_move);
  if ((char)v_src_move_diff_capacity.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity_move);
    if (v_src_move_diff_capacity.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)v_src_move_diff_capacity.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_18,(Message *)&vs_diff_capacity_move);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    if (vs_diff_capacity_move.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity_move.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)v_src_move_diff_capacity.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity_move,"1",(allocator<char> *)&gtest_ar_18);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&v_src_move_diff_capacity,"std::string(\"1\")","vs_diff_capacity[1]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &vs_diff_capacity_move,vs_diff_capacity.data_ptr_ + 1);
  std::__cxx11::string::~string((string *)&vs_diff_capacity_move);
  if ((char)v_src_move_diff_capacity.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity_move);
    if (v_src_move_diff_capacity.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)v_src_move_diff_capacity.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_18,(Message *)&vs_diff_capacity_move);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    if (vs_diff_capacity_move.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity_move.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)v_src_move_diff_capacity.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity_move,"2",(allocator<char> *)&gtest_ar_18);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&v_src_move_diff_capacity,"std::string(\"2\")","vs_diff_capacity[2]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &vs_diff_capacity_move,vs_diff_capacity.data_ptr_ + 2);
  std::__cxx11::string::~string((string *)&vs_diff_capacity_move);
  if ((char)v_src_move_diff_capacity.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity_move);
    if (v_src_move_diff_capacity.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)v_src_move_diff_capacity.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_18,(Message *)&vs_diff_capacity_move);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    if (vs_diff_capacity_move.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity_move.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)v_src_move_diff_capacity.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity_move,"3",(allocator<char> *)&gtest_ar_18);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&v_src_move_diff_capacity,"std::string(\"3\")","vs_diff_capacity[3]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &vs_diff_capacity_move,vs_diff_capacity.data_ptr_ + 3);
  std::__cxx11::string::~string((string *)&vs_diff_capacity_move);
  if ((char)v_src_move_diff_capacity.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity_move);
    if (v_src_move_diff_capacity.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)v_src_move_diff_capacity.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_18,(Message *)&vs_diff_capacity_move);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    if (vs_diff_capacity_move.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity_move.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)v_src_move_diff_capacity.data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_diff_capacity_move,"4",(allocator<char> *)&gtest_ar_18);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&v_src_move_diff_capacity,"std::string(\"4\")","vs_diff_capacity[4]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &vs_diff_capacity_move,vs_diff_capacity.data_ptr_ + 4);
  std::__cxx11::string::~string((string *)&vs_diff_capacity_move);
  if ((char)v_src_move_diff_capacity.size_ == '\0') {
    testing::Message::Message((Message *)&vs_diff_capacity_move);
    if (v_src_move_diff_capacity.data_._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)v_src_move_diff_capacity.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_18,(Message *)&vs_diff_capacity_move);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    if (vs_diff_capacity_move.size_ != 0) {
      (**(code **)(*(long *)vs_diff_capacity_move.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)v_src_move_diff_capacity.data_);
  vs_diff_capacity_move.size_ =
       (size_type)
       v_raw_src.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  gtest_ar_18._0_8_ =
       v_raw_src.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  estl::vector_s<std::__cxx11::string,10ul>::
  vector_s<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector_s<std::__cxx11::string,10ul> *)&v_src_move_diff_capacity,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vs_diff_capacity_move,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar_18);
  estl::vector_s<std::__cxx11::string,12ul>::vector_s<10ul>
            ((vector_s<std::__cxx11::string,12ul> *)&vs_diff_capacity_move,&v_src_move_diff_capacity
            );
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__3.success_ = vs_diff_capacity_move.size_ != 0;
  if (vs_diff_capacity_move.size_ == 0) {
    testing::Message::Message((Message *)&local_a20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_18,(internal *)&gtest_ar__3,
               (AssertionResult *)"vs_diff_capacity_move.empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_9e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x88,(char *)gtest_ar_18._0_8_);
    testing::internal::AssertHelper::operator=(&local_9e8,(Message *)&local_a20);
    testing::internal::AssertHelper::~AssertHelper(&local_9e8);
    std::__cxx11::string::~string((string *)&gtest_ar_18);
    if ((long *)CONCAT44(local_a20.data_._4_4_,local_a20.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a20.data_._4_4_,local_a20.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  local_a20.data_._0_4_ = 5;
  gtest_ar__3._0_8_ = vs_diff_capacity_move.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_18,"5u","vs_diff_capacity_move.size()",(uint *)&local_a20,
             (unsigned_long *)&gtest_ar__3);
  if (gtest_ar_18.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_18.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_18.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a20,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    if (gtest_ar__3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_18.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_18,"0",(allocator<char> *)&local_a20);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar__3,"std::string(\"0\")","vs_diff_capacity_move[0]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_18,
             vs_diff_capacity_move.data_ptr_);
  std::__cxx11::string::~string((string *)&gtest_ar_18);
  if (gtest_ar__3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_18);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar__3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a20,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    if (gtest_ar_18._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_18._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_18,"1",(allocator<char> *)&local_a20);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar__3,"std::string(\"1\")","vs_diff_capacity_move[1]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_18,
             vs_diff_capacity_move.data_ptr_ + 1);
  std::__cxx11::string::~string((string *)&gtest_ar_18);
  if (gtest_ar__3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_18);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar__3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a20,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    if (gtest_ar_18._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_18._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_18,"2",(allocator<char> *)&local_a20);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar__3,"std::string(\"2\")","vs_diff_capacity_move[2]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_18,
             vs_diff_capacity_move.data_ptr_ + 2);
  std::__cxx11::string::~string((string *)&gtest_ar_18);
  if (gtest_ar__3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_18);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar__3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a20,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    if (gtest_ar_18._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_18._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_18,"3",(allocator<char> *)&local_a20);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar__3,"std::string(\"3\")","vs_diff_capacity_move[3]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_18,
             vs_diff_capacity_move.data_ptr_ + 3);
  std::__cxx11::string::~string((string *)&gtest_ar_18);
  if (gtest_ar__3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_18);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar__3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a20,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    if (gtest_ar_18._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_18._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_18,"4",(allocator<char> *)&local_a20);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar__3,"std::string(\"4\")","vs_diff_capacity_move[4]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_18,
             vs_diff_capacity_move.data_ptr_ + 4);
  std::__cxx11::string::~string((string *)&gtest_ar_18);
  if (gtest_ar__3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_18);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar__3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a20,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    if (gtest_ar_18._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_18._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>::
  ~vector_s(&vs_diff_capacity_move);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s(&v_src_move_diff_capacity);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_12UL>::
  ~vector_s(&vs_diff_capacity);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s(&vs_move);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s(&v_src_move);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s(&vs);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s(&v_src);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v_raw_src);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, copy_constructor)
{
    std::vector<std::string> v_raw_src{"0","1","2","3","4"};

    vector_s<std::string, 10> v_src(v_raw_src.begin(), v_raw_src.end());
    vector_s<std::string, 10> vs(v_src);
    EXPECT_FALSE(vs.empty());
    EXPECT_EQ(5u, vs.size());
    EXPECT_EQ(std::string("0"), vs[0]);
    EXPECT_EQ(std::string("1"), vs[1]);
    EXPECT_EQ(std::string("2"), vs[2]);
    EXPECT_EQ(std::string("3"), vs[3]);
    EXPECT_EQ(std::string("4"), vs[4]);

    vector_s<std::string, 10> v_src_move(v_raw_src.begin(), v_raw_src.end());
    vector_s<std::string, 10> vs_move(std::move(v_src_move));
    EXPECT_FALSE(vs_move.empty());
    EXPECT_EQ(5u, vs_move.size());
    EXPECT_EQ(std::string("0"), vs_move[0]);
    EXPECT_EQ(std::string("1"), vs_move[1]);
    EXPECT_EQ(std::string("2"), vs_move[2]);
    EXPECT_EQ(std::string("3"), vs_move[3]);
    EXPECT_EQ(std::string("4"), vs_move[4]);

    vector_s<std::string, 12> vs_diff_capacity(v_src);
    EXPECT_FALSE(vs_diff_capacity.empty());
    EXPECT_EQ(5u, vs_diff_capacity.size());
    EXPECT_EQ(std::string("0"), vs_diff_capacity[0]);
    EXPECT_EQ(std::string("1"), vs_diff_capacity[1]);
    EXPECT_EQ(std::string("2"), vs_diff_capacity[2]);
    EXPECT_EQ(std::string("3"), vs_diff_capacity[3]);
    EXPECT_EQ(std::string("4"), vs_diff_capacity[4]);

    vector_s<std::string, 10> v_src_move_diff_capacity(v_raw_src.begin(), v_raw_src.end());
    vector_s<std::string, 12> vs_diff_capacity_move(std::move(v_src_move_diff_capacity));
    EXPECT_FALSE(vs_diff_capacity_move.empty());
    EXPECT_EQ(5u, vs_diff_capacity_move.size());
    EXPECT_EQ(std::string("0"), vs_diff_capacity_move[0]);
    EXPECT_EQ(std::string("1"), vs_diff_capacity_move[1]);
    EXPECT_EQ(std::string("2"), vs_diff_capacity_move[2]);
    EXPECT_EQ(std::string("3"), vs_diff_capacity_move[3]);
    EXPECT_EQ(std::string("4"), vs_diff_capacity_move[4]);

}